

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O3

void __thiscall cfd::core::Transaction::Transaction(Transaction *this,Transaction *transaction)

{
  string local_30;
  
  AbstractTransaction::GetHex_abi_cxx11_(&local_30,&transaction->super_AbstractTransaction);
  Transaction(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

Transaction::Transaction(const Transaction &transaction)
    : Transaction(transaction.GetHex()) {
  // copy constructor
}